

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  ulong uVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"[",1);
  if ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(ofs,", ",2);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)ofs);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(v->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(v->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"]",1);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<uint64_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}